

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack1to8.h
# Opt level: O1

void ncnn::im2col_sgemm_pack1to8_avx
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  int iVar6;
  uint _h;
  size_t sVar7;
  size_t sVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  int *piVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  uint uVar20;
  _func_int ***ppp_Var21;
  undefined4 *puVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  undefined4 *puVar27;
  float *pfVar28;
  ulong uVar29;
  undefined1 (*pauVar30) [32];
  uint uVar31;
  ulong uVar32;
  undefined1 (*pauVar33) [16];
  int iVar34;
  undefined1 (*pauVar35) [32];
  undefined4 *puVar36;
  int iVar37;
  long lVar38;
  int iVar39;
  long lVar40;
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  float zeros [8];
  Mat local_b8;
  ulong local_70;
  Allocator *local_68;
  void *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  uVar5 = bottom_im2col->w;
  uVar25 = (ulong)(int)uVar5;
  iVar6 = bottom_im2col->h;
  _h = bottom_im2col->c;
  uVar24 = (ulong)_h;
  local_70 = (ulong)(uint)top_blob->c;
  local_60 = _bias->data;
  local_b8.cstep = 0;
  local_b8.data = (Allocator *)0x0;
  local_b8.refcount._0_4_ = 0;
  local_b8.refcount._4_4_ = 0;
  local_b8.elemsize._0_4_ = 0;
  local_b8.elempack = 0;
  local_b8._48_8_ = SUB168(ZEXT816(0) << 0x40,4);
  if ((long)uVar25 < 8) {
    uVar20 = uVar5;
    iVar37 = iVar6;
    if (3 < (int)uVar5) {
      iVar37 = iVar6 * 4;
      uVar20 = (uVar5 & 3) + 1;
    }
  }
  else {
    uVar20 = (uVar5 & 3) + (uVar5 >> 3) + (uint)((uVar5 >> 2 & 1) != 0);
    iVar37 = iVar6 * 8;
  }
  local_b8.elemsize._4_4_ = (int)local_b8.refcount;
  local_b8.allocator = (Allocator *)local_b8.data;
  local_b8.dims = (int)local_b8.refcount;
  local_b8.w = local_b8.refcount._4_4_;
  local_b8.c = local_b8.elempack;
  Mat::create(&local_b8,iVar37,_h,uVar20,4,1,opt->workspace_allocator);
  uVar20 = (int)uVar5 >> 3;
  if (0 < (int)uVar20) {
    lVar26 = 0;
    uVar29 = 0;
    do {
      if (0 < (int)_h) {
        ppp_Var21 = (_func_int ***)
                    ((long)(_func_int ***)local_b8.data +
                    local_b8.cstep * uVar29 *
                    CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize));
        uVar32 = 0;
        do {
          if (0 < iVar6) {
            pauVar35 = (undefined1 (*) [32])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar32 + lVar26);
            iVar37 = iVar6;
            do {
              *(undefined1 (*) [32])ppp_Var21 = *pauVar35;
              ppp_Var21 = ppp_Var21 + 4;
              pauVar35 = (undefined1 (*) [32])(*pauVar35 + uVar25 * 4);
              iVar37 = iVar37 + -1;
            } while (iVar37 != 0);
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 != uVar24);
      }
      uVar29 = uVar29 + 1;
      lVar26 = lVar26 + 0x20;
    } while (uVar29 != uVar20);
  }
  uVar23 = uVar5 >> 2 & 1;
  if ((uVar23 != 0) && (0 < (int)_h)) {
    ppp_Var21 = (_func_int ***)
                ((long)(_func_int ***)local_b8.data +
                (long)(int)uVar20 * local_b8.cstep *
                CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize));
    uVar29 = 0;
    do {
      if (0 < iVar6) {
        pauVar33 = (undefined1 (*) [16])
                   ((long)bottom_im2col->data +
                   bottom_im2col->cstep * bottom_im2col->elemsize * uVar29 +
                   (uVar25 & 0xfffffffffffffff8) * 4);
        iVar37 = iVar6;
        do {
          *(undefined1 (*) [16])ppp_Var21 = *pauVar33;
          ppp_Var21 = ppp_Var21 + 2;
          pauVar33 = (undefined1 (*) [16])(*pauVar33 + uVar25 * 4);
          iVar37 = iVar37 + -1;
        } while (iVar37 != 0);
      }
      uVar29 = uVar29 + 1;
    } while (uVar29 != uVar24);
  }
  iVar37 = (int)(uVar25 & 0xfffffffffffffff8) + uVar23 * 4;
  if (iVar37 < (int)uVar5) {
    local_68 = (Allocator *)local_b8.data;
    lVar26 = (long)iVar37;
    puVar22 = (undefined4 *)(lVar26 * 4 + (long)bottom_im2col->data);
    sVar7 = bottom_im2col->cstep;
    sVar8 = bottom_im2col->elemsize;
    do {
      if (0 < (int)_h) {
        uVar20 = (uint)lVar26;
        uVar31 = uVar20 + 7;
        uVar23 = uVar20 + 3;
        if (-1 < (int)uVar20) {
          uVar31 = uVar20;
          uVar23 = uVar20;
        }
        iVar34 = uVar20 - (uVar31 & 0xfffffff8);
        iVar37 = (uVar20 - (uVar31 & 0xfffffff8)) + 3;
        if (-1 < iVar34) {
          iVar37 = iVar34;
        }
        ppp_Var21 = (_func_int ***)
                    ((long)(_func_int ***)local_b8.data +
                    (long)(int)((iVar37 >> 2) +
                               ((int)uVar31 >> 3) + (uVar20 - (uVar23 & 0xfffffffc))) *
                    local_b8.cstep * CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize)
                    );
        uVar29 = 0;
        puVar27 = puVar22;
        do {
          puVar36 = puVar27;
          iVar37 = iVar6;
          if (0 < iVar6) {
            do {
              *(undefined4 *)ppp_Var21 = *puVar36;
              ppp_Var21 = (_func_int ***)((long)ppp_Var21 + 4);
              puVar36 = puVar36 + uVar25;
              iVar37 = iVar37 + -1;
            } while (iVar37 != 0);
          }
          uVar29 = uVar29 + 1;
          puVar27 = (undefined4 *)((long)puVar27 + sVar7 * sVar8);
        } while (uVar29 != uVar24);
      }
      lVar26 = lVar26 + 1;
      puVar22 = puVar22 + 1;
    } while (lVar26 < (long)uVar25);
  }
  if (0 < (int)local_70) {
    iVar37 = _h * iVar6;
    uVar24 = 0;
    do {
      pauVar30 = (undefined1 (*) [32])
                 (top_blob->cstep * uVar24 * top_blob->elemsize + (long)top_blob->data);
      pauVar35 = (undefined1 (*) [32])(uVar24 * 0x20 + (long)local_60);
      if (local_60 == (void *)0x0) {
        pauVar35 = (undefined1 (*) [32])&local_58;
      }
      local_58 = 0;
      uStack_50 = 0;
      uStack_48 = 0;
      uStack_40 = 0;
      if ((int)uVar5 < 8) {
        uVar29 = 0;
      }
      else {
        lVar26 = 0;
        uVar32 = 0;
        do {
          auVar50 = *pauVar35;
          auVar48 = auVar50;
          auVar46 = auVar50;
          auVar53 = auVar50;
          auVar52 = auVar50;
          auVar51 = auVar50;
          auVar44 = auVar50;
          auVar41 = auVar50;
          if (0 < iVar37) {
            lVar38 = local_b8.cstep *
                     CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize) * lVar26;
            lVar40 = 0;
            iVar34 = iVar37;
            auVar49 = auVar50;
            auVar47 = auVar50;
            auVar45 = auVar50;
            auVar42 = auVar50;
            auVar43 = auVar50;
            auVar17 = auVar50;
            auVar18 = auVar50;
            auVar19 = auVar50;
            do {
              pfVar28 = (float *)((long)kernel->data +
                                 lVar40 + kernel->cstep * uVar24 * kernel->elemsize);
              fVar3 = *pfVar28;
              fVar4 = pfVar28[1];
              fVar9 = pfVar28[2];
              fVar10 = pfVar28[3];
              fVar11 = pfVar28[4];
              fVar12 = pfVar28[5];
              fVar13 = pfVar28[6];
              fVar1 = *(float *)((long)(_func_int ***)local_b8.data + lVar40 + lVar38);
              fVar2 = *(float *)((long)(_func_int ***)local_b8.data + lVar40 + lVar38 + 4);
              auVar53._0_4_ = fVar1 * fVar3 + auVar19._0_4_;
              auVar53._4_4_ = fVar1 * fVar4 + auVar19._4_4_;
              auVar53._8_4_ = fVar1 * fVar9 + auVar19._8_4_;
              auVar53._12_4_ = fVar1 * fVar10 + auVar19._12_4_;
              auVar53._16_4_ = fVar1 * fVar11 + auVar19._16_4_;
              auVar53._20_4_ = fVar1 * fVar12 + auVar19._20_4_;
              auVar53._24_4_ = fVar1 * fVar13 + auVar19._24_4_;
              auVar53._28_4_ = fVar1 + auVar19._28_4_;
              auVar52._0_4_ = fVar2 * fVar3 + auVar18._0_4_;
              auVar52._4_4_ = fVar2 * fVar4 + auVar18._4_4_;
              auVar52._8_4_ = fVar2 * fVar9 + auVar18._8_4_;
              auVar52._12_4_ = fVar2 * fVar10 + auVar18._12_4_;
              auVar52._16_4_ = fVar2 * fVar11 + auVar18._16_4_;
              auVar52._20_4_ = fVar2 * fVar12 + auVar18._20_4_;
              auVar52._24_4_ = fVar2 * fVar13 + auVar18._24_4_;
              auVar52._28_4_ = fVar1 + auVar18._28_4_;
              fVar1 = *(float *)((long)&((Allocator *)((long)local_b8.data + 8))->_vptr_Allocator +
                                lVar40 + lVar38);
              fVar2 = *(float *)((long)&((Allocator *)((long)local_b8.data + 8))->_vptr_Allocator +
                                lVar40 + lVar38 + 4);
              auVar51._0_4_ = fVar1 * fVar3 + auVar17._0_4_;
              auVar51._4_4_ = fVar1 * fVar4 + auVar17._4_4_;
              auVar51._8_4_ = fVar1 * fVar9 + auVar17._8_4_;
              auVar51._12_4_ = fVar1 * fVar10 + auVar17._12_4_;
              auVar51._16_4_ = fVar1 * fVar11 + auVar17._16_4_;
              auVar51._20_4_ = fVar1 * fVar12 + auVar17._20_4_;
              auVar51._24_4_ = fVar1 * fVar13 + auVar17._24_4_;
              auVar51._28_4_ = fVar1 + auVar17._28_4_;
              auVar50._0_4_ = fVar2 * fVar3 + auVar45._0_4_;
              auVar50._4_4_ = fVar2 * fVar4 + auVar45._4_4_;
              auVar50._8_4_ = fVar2 * fVar9 + auVar45._8_4_;
              auVar50._12_4_ = fVar2 * fVar10 + auVar45._12_4_;
              auVar50._16_4_ = fVar2 * fVar11 + auVar45._16_4_;
              auVar50._20_4_ = fVar2 * fVar12 + auVar45._20_4_;
              auVar50._24_4_ = fVar2 * fVar13 + auVar45._24_4_;
              auVar50._28_4_ = fVar1 + auVar45._28_4_;
              fVar1 = *(float *)((long)&((Allocator *)((long)local_b8.data + 0x10))->_vptr_Allocator
                                + lVar40 + lVar38);
              fVar2 = *(float *)((long)&((Allocator *)((long)local_b8.data + 0x10))->_vptr_Allocator
                                + lVar40 + lVar38 + 4);
              auVar48._0_4_ = fVar1 * fVar3 + auVar47._0_4_;
              auVar48._4_4_ = fVar1 * fVar4 + auVar47._4_4_;
              auVar48._8_4_ = fVar1 * fVar9 + auVar47._8_4_;
              auVar48._12_4_ = fVar1 * fVar10 + auVar47._12_4_;
              auVar48._16_4_ = fVar1 * fVar11 + auVar47._16_4_;
              auVar48._20_4_ = fVar1 * fVar12 + auVar47._20_4_;
              auVar48._24_4_ = fVar1 * fVar13 + auVar47._24_4_;
              auVar48._28_4_ = fVar1 + auVar47._28_4_;
              auVar46._0_4_ = fVar2 * fVar3 + auVar49._0_4_;
              auVar46._4_4_ = fVar2 * fVar4 + auVar49._4_4_;
              auVar46._8_4_ = fVar2 * fVar9 + auVar49._8_4_;
              auVar46._12_4_ = fVar2 * fVar10 + auVar49._12_4_;
              auVar46._16_4_ = fVar2 * fVar11 + auVar49._16_4_;
              auVar46._20_4_ = fVar2 * fVar12 + auVar49._20_4_;
              auVar46._24_4_ = fVar2 * fVar13 + auVar49._24_4_;
              auVar46._28_4_ = fVar1 + auVar49._28_4_;
              fVar1 = *(float *)((long)&((Allocator *)((long)local_b8.data + 0x18))->_vptr_Allocator
                                + lVar40 + lVar38);
              fVar2 = *(float *)((long)&((Allocator *)((long)local_b8.data + 0x18))->_vptr_Allocator
                                + lVar40 + lVar38 + 4);
              auVar44._0_4_ = fVar1 * fVar3 + auVar43._0_4_;
              auVar44._4_4_ = fVar1 * fVar4 + auVar43._4_4_;
              auVar44._8_4_ = fVar1 * fVar9 + auVar43._8_4_;
              auVar44._12_4_ = fVar1 * fVar10 + auVar43._12_4_;
              auVar44._16_4_ = fVar1 * fVar11 + auVar43._16_4_;
              auVar44._20_4_ = fVar1 * fVar12 + auVar43._20_4_;
              auVar44._24_4_ = fVar1 * fVar13 + auVar43._24_4_;
              auVar44._28_4_ = fVar1 + auVar43._28_4_;
              auVar41._0_4_ = fVar2 * fVar3 + auVar42._0_4_;
              auVar41._4_4_ = fVar2 * fVar4 + auVar42._4_4_;
              auVar41._8_4_ = fVar2 * fVar9 + auVar42._8_4_;
              auVar41._12_4_ = fVar2 * fVar10 + auVar42._12_4_;
              auVar41._16_4_ = fVar2 * fVar11 + auVar42._16_4_;
              auVar41._20_4_ = fVar2 * fVar12 + auVar42._20_4_;
              auVar41._24_4_ = fVar2 * fVar13 + auVar42._24_4_;
              auVar41._28_4_ = pfVar28[7] + auVar42._28_4_;
              lVar40 = lVar40 + 0x20;
              iVar34 = iVar34 + -1;
              auVar49 = auVar46;
              auVar47 = auVar48;
              auVar45 = auVar50;
              auVar42 = auVar41;
              auVar43 = auVar44;
              auVar17 = auVar51;
              auVar18 = auVar52;
              auVar19 = auVar53;
            } while (iVar34 != 0);
          }
          *pauVar30 = auVar53;
          pauVar30[1] = auVar52;
          pauVar30[2] = auVar51;
          pauVar30[3] = auVar50;
          pauVar30[4] = auVar48;
          pauVar30[5] = auVar46;
          pauVar30[6] = auVar44;
          pauVar30[7] = auVar41;
          pauVar30 = pauVar30 + 8;
          uVar29 = uVar32 + 8;
          lVar38 = uVar32 + 0xf;
          lVar26 = lVar26 + 1;
          uVar32 = uVar29;
        } while (lVar38 < (long)uVar25);
      }
      if ((int)((uint)uVar29 | 3) < (int)uVar5) {
        uVar20 = 0;
        do {
          auVar49 = *pauVar35;
          iVar34 = (int)uVar29;
          auVar47 = auVar49;
          auVar45 = auVar49;
          auVar42 = auVar49;
          if (0 < (int)(_h * iVar6)) {
            lVar26 = local_b8.cstep *
                     CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize) *
                     (ulong)((uVar20 & 1) + ((uint)(uVar29 >> 3) & 0x1fffffff));
            lVar38 = 0;
            auVar50 = auVar49;
            auVar48 = auVar49;
            iVar39 = iVar37;
            auVar46 = auVar49;
            auVar53 = auVar49;
            do {
              pfVar28 = (float *)((long)kernel->data +
                                 lVar38 * 2 + kernel->cstep * uVar24 * kernel->elemsize);
              fVar9 = *pfVar28;
              fVar10 = pfVar28[1];
              fVar11 = pfVar28[2];
              fVar12 = pfVar28[3];
              fVar13 = pfVar28[4];
              fVar14 = pfVar28[5];
              fVar15 = pfVar28[6];
              fVar1 = *(float *)((long)(_func_int ***)local_b8.data + lVar38 + lVar26);
              fVar2 = *(float *)((long)(_func_int ***)local_b8.data + lVar38 + lVar26 + 4);
              fVar3 = *(float *)((long)&((Allocator *)((long)local_b8.data + 8))->_vptr_Allocator +
                                lVar38 + lVar26);
              fVar4 = *(float *)((long)&((Allocator *)((long)local_b8.data + 8))->_vptr_Allocator +
                                lVar38 + lVar26 + 4);
              auVar49._0_4_ = fVar1 * fVar9 + auVar48._0_4_;
              auVar49._4_4_ = fVar1 * fVar10 + auVar48._4_4_;
              auVar49._8_4_ = fVar1 * fVar11 + auVar48._8_4_;
              auVar49._12_4_ = fVar1 * fVar12 + auVar48._12_4_;
              auVar49._16_4_ = fVar1 * fVar13 + auVar48._16_4_;
              auVar49._20_4_ = fVar1 * fVar14 + auVar48._20_4_;
              auVar49._24_4_ = fVar1 * fVar15 + auVar48._24_4_;
              auVar49._28_4_ = fVar1 + auVar48._28_4_;
              auVar47._0_4_ = fVar2 * fVar9 + auVar50._0_4_;
              auVar47._4_4_ = fVar2 * fVar10 + auVar50._4_4_;
              auVar47._8_4_ = fVar2 * fVar11 + auVar50._8_4_;
              auVar47._12_4_ = fVar2 * fVar12 + auVar50._12_4_;
              auVar47._16_4_ = fVar2 * fVar13 + auVar50._16_4_;
              auVar47._20_4_ = fVar2 * fVar14 + auVar50._20_4_;
              auVar47._24_4_ = fVar2 * fVar15 + auVar50._24_4_;
              auVar47._28_4_ = fVar1 + auVar50._28_4_;
              auVar45._0_4_ = fVar3 * fVar9 + auVar53._0_4_;
              auVar45._4_4_ = fVar3 * fVar10 + auVar53._4_4_;
              auVar45._8_4_ = fVar3 * fVar11 + auVar53._8_4_;
              auVar45._12_4_ = fVar3 * fVar12 + auVar53._12_4_;
              auVar45._16_4_ = fVar3 * fVar13 + auVar53._16_4_;
              auVar45._20_4_ = fVar3 * fVar14 + auVar53._20_4_;
              auVar45._24_4_ = fVar3 * fVar15 + auVar53._24_4_;
              auVar45._28_4_ = fVar1 + auVar53._28_4_;
              auVar42._0_4_ = fVar4 * fVar9 + auVar46._0_4_;
              auVar42._4_4_ = fVar4 * fVar10 + auVar46._4_4_;
              auVar42._8_4_ = fVar4 * fVar11 + auVar46._8_4_;
              auVar42._12_4_ = fVar4 * fVar12 + auVar46._12_4_;
              auVar42._16_4_ = fVar4 * fVar13 + auVar46._16_4_;
              auVar42._20_4_ = fVar4 * fVar14 + auVar46._20_4_;
              auVar42._24_4_ = fVar4 * fVar15 + auVar46._24_4_;
              auVar42._28_4_ = pfVar28[7] + auVar46._28_4_;
              lVar38 = lVar38 + 0x10;
              iVar39 = iVar39 + -1;
              auVar50 = auVar47;
              auVar48 = auVar49;
              auVar46 = auVar42;
              auVar53 = auVar45;
            } while (iVar39 != 0);
          }
          *pauVar30 = auVar49;
          pauVar30[1] = auVar47;
          pauVar30[2] = auVar45;
          pauVar30[3] = auVar42;
          pauVar30 = pauVar30 + 4;
          uVar23 = iVar34 + 4;
          uVar32 = (ulong)uVar23;
          uVar20 = (uint)(byte)((char)uVar20 + 1);
          uVar29 = (ulong)uVar23;
        } while (iVar34 + 7 < (int)uVar5);
      }
      else {
        uVar32 = uVar29 & 0xffffffff;
      }
      if ((int)uVar32 < (int)uVar5) {
        do {
          uVar20 = (uint)uVar32;
          auVar43 = *pauVar35;
          if (0 < (int)(_h * iVar6)) {
            pfVar28 = (float *)(kernel->cstep * uVar24 * kernel->elemsize + (long)kernel->data);
            lVar26 = 0;
            auVar50 = auVar43;
            do {
              fVar1 = *(float *)((long)(_func_int ***)local_b8.data +
                                lVar26 * 4 +
                                local_b8.cstep *
                                CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize) *
                                (ulong)((uVar20 & 3) + (int)(uVar32 >> 3) +
                                       (uint)((uVar20 >> 2 & 1) != 0)));
              auVar43._0_4_ = fVar1 * *pfVar28 + auVar50._0_4_;
              auVar43._4_4_ = fVar1 * pfVar28[1] + auVar50._4_4_;
              auVar43._8_4_ = fVar1 * pfVar28[2] + auVar50._8_4_;
              auVar43._12_4_ = fVar1 * pfVar28[3] + auVar50._12_4_;
              auVar43._16_4_ = fVar1 * pfVar28[4] + auVar50._16_4_;
              auVar43._20_4_ = fVar1 * pfVar28[5] + auVar50._20_4_;
              auVar43._24_4_ = fVar1 * pfVar28[6] + auVar50._24_4_;
              auVar43._28_4_ = fVar1 + auVar50._28_4_;
              pfVar28 = pfVar28 + 8;
              lVar26 = lVar26 + 1;
              auVar50 = auVar43;
            } while (iVar37 != (int)lVar26);
          }
          *pauVar30 = auVar43;
          pauVar30 = pauVar30 + 1;
          uVar32 = (ulong)(uVar20 + 1);
        } while (uVar20 + 1 != uVar5);
      }
      uVar24 = uVar24 + 1;
    } while (uVar24 != local_70);
  }
  piVar16 = (int *)CONCAT44(local_b8.refcount._4_4_,(int)local_b8.refcount);
  if (piVar16 != (int *)0x0) {
    LOCK();
    *piVar16 = *piVar16 + -1;
    UNLOCK();
    if (*piVar16 == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_b8.data != (Allocator *)0x0) {
          free(local_b8.data);
        }
      }
      else {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack1to8_avx(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 4u, 1, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    const float* bias = _bias;

    // permute
    Mat tmp;
    if (size >= 8)
        tmp.create(8 * maxk, inch, size / 8 + (size % 8) / 4 + size % 4, 4u, 1, opt.workspace_allocator);
    else if (size >= 4)
        tmp.create(4 * maxk, inch, size / 4 + size % 4, 4u, 1, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 4u, 1, opt.workspace_allocator);
    {
        int nn_size = size >> 3;
        int remain_size_start = 0;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 8;

            float* tmpptr = tmp.channel(i / 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m256 _r0 = _mm256_loadu_ps(img0);
                    _mm256_store_ps(tmpptr, _r0);

                    img0 += size;
                    tmpptr += 8;
                }
            }
        }

        remain_size_start += nn_size << 3;
        nn_size = (size - remain_size_start) >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m128 _r0 = _mm_loadu_ps(img0);
                    _mm_store_ps(tmpptr, _r0);

                    img0 += size;
                    tmpptr += 4;
                }
            }
        }

        remain_size_start += nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    img0 += size;
                    tmpptr += 1;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float zeros[8] = {0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 8 : zeros;

        int i = 0;
        for (; i + 7 < size; i += 8)
        {
            const float* tmpptr = tmp.channel(i / 8);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m256 _sum0 = _mm256_loadu_ps(biasptr);
            __m256 _sum1 = _sum0;
            __m256 _sum2 = _sum0;
            __m256 _sum3 = _sum0;
            __m256 _sum4 = _sum0;
            __m256 _sum5 = _sum0;
            __m256 _sum6 = _sum0;
            __m256 _sum7 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m256 _w0 = _mm256_load_ps(kptr0);

                __m256 _val0 = _mm256_broadcast_ss(tmpptr);
                __m256 _val1 = _mm256_broadcast_ss(tmpptr + 1);
                _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_val1, _w0, _sum1);
                __m256 _val2 = _mm256_broadcast_ss(tmpptr + 2);
                __m256 _val3 = _mm256_broadcast_ss(tmpptr + 3);
                _sum2 = _mm256_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_val3, _w0, _sum3);
                __m256 _val4 = _mm256_broadcast_ss(tmpptr + 4);
                __m256 _val5 = _mm256_broadcast_ss(tmpptr + 5);
                _sum4 = _mm256_comp_fmadd_ps(_val4, _w0, _sum4);
                _sum5 = _mm256_comp_fmadd_ps(_val5, _w0, _sum5);
                __m256 _val6 = _mm256_broadcast_ss(tmpptr + 6);
                __m256 _val7 = _mm256_broadcast_ss(tmpptr + 7);
                _sum6 = _mm256_comp_fmadd_ps(_val6, _w0, _sum6);
                _sum7 = _mm256_comp_fmadd_ps(_val7, _w0, _sum7);

                tmpptr += 8;
                kptr0 += 8;
            }

            _mm256_store_ps(outptr0, _sum0);
            _mm256_store_ps(outptr0 + 8, _sum1);
            _mm256_store_ps(outptr0 + 8 * 2, _sum2);
            _mm256_store_ps(outptr0 + 8 * 3, _sum3);
            _mm256_store_ps(outptr0 + 8 * 4, _sum4);
            _mm256_store_ps(outptr0 + 8 * 5, _sum5);
            _mm256_store_ps(outptr0 + 8 * 6, _sum6);
            _mm256_store_ps(outptr0 + 8 * 7, _sum7);
            outptr0 += 64;
        }
        for (; i + 3 < size; i += 4)
        {
            const float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m256 _sum0 = _mm256_loadu_ps(biasptr);
            __m256 _sum1 = _sum0;
            __m256 _sum2 = _sum0;
            __m256 _sum3 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m256 _w0 = _mm256_load_ps(kptr0);

                __m256 _val0 = _mm256_broadcast_ss(tmpptr);
                __m256 _val1 = _mm256_broadcast_ss(tmpptr + 1);
                __m256 _val2 = _mm256_broadcast_ss(tmpptr + 2);
                __m256 _val3 = _mm256_broadcast_ss(tmpptr + 3);

                _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_val3, _w0, _sum3);

                tmpptr += 4;
                kptr0 += 8;
            }

            _mm256_store_ps(outptr0, _sum0);
            _mm256_store_ps(outptr0 + 8, _sum1);
            _mm256_store_ps(outptr0 + 16, _sum2);
            _mm256_store_ps(outptr0 + 24, _sum3);
            outptr0 += 32;
        }
        for (; i < size; i++)
        {
            const float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m256 _sum = _mm256_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m256 _w0 = _mm256_load_ps(kptr0);
                __m256 _val = _mm256_broadcast_ss(tmpptr);
                _sum = _mm256_comp_fmadd_ps(_w0, _val, _sum);

                tmpptr += 1;
                kptr0 += 8;
            }

            _mm256_store_ps(outptr0, _sum);
            outptr0 += 8;
        }
    }
}